

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O2

SDL_Rect __thiscall
solitaire::graphics::SDLGraphicsSystem::createSrcRect(SDLGraphicsSystem *this,Area *area)

{
  SDL_Rect SVar1;
  
  SVar1.x = (area->position).x;
  SVar1.y = (area->position).y;
  SVar1.w = (area->size).width;
  SVar1.h = (area->size).height;
  return SVar1;
}

Assistant:

SDL_Rect SDLGraphicsSystem::createSrcRect(const Area& area) const {
    return SDL_Rect {
        area.position.x, area.position.y,
        area.size.width, area.size.height
    };
}